

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# control_vehicle.c
# Opt level: O0

void robot_speed(SpurUserParamsPtr spur)

{
  double dVar1;
  ParametersPtr p_Var2;
  double dVar3;
  double dVar4;
  double dVar5;
  ParametersPtr param;
  int vc_i;
  int i;
  SpurUserParamsPtr spur_local;
  
  p_Var2 = get_param_ptr();
  param._0_4_ = 0;
  for (param._4_4_ = MOTOR_RIGHT; (int)param._4_4_ < 0x10; param._4_4_ = param._4_4_ + MOTOR_LEFT) {
    if ((p_Var2->motor_enable[(int)param._4_4_] != 0) &&
       (dVar3 = p(YP_PARAM_VEHICLE_CONTROL,param._4_4_), 0.0 < dVar3)) {
      spur->wheel_vel_smooth[(int)param._4_4_] = 0.0;
      spur->wheel_mode[(int)param._4_4_] = MOTOR_CONTROL_VEHICLE;
      if ((int)param == 0) {
        dVar3 = spur->wref_smooth;
        dVar4 = p(YP_PARAM_TREAD,MOTOR_RIGHT);
        dVar1 = spur->vref_smooth;
        dVar5 = p(YP_PARAM_RADIUS,param._4_4_);
        spur->wheel_vel_smooth[(int)param._4_4_] = (dVar3 * 0.5 * dVar4 + dVar1) / dVar5;
      }
      else if ((int)param == 1) {
        dVar3 = spur->wref_smooth;
        dVar4 = p(YP_PARAM_TREAD,MOTOR_RIGHT);
        dVar1 = spur->vref_smooth;
        dVar5 = p(YP_PARAM_RADIUS,param._4_4_);
        spur->wheel_vel_smooth[(int)param._4_4_] = -(dVar3 * 0.5 * dVar4 + -dVar1) / dVar5;
      }
      param._0_4_ = (int)param + 1;
    }
  }
  return;
}

Assistant:

void robot_speed(SpurUserParamsPtr spur)
{
  int i;
  int vc_i;

  ParametersPtr param;
  param = get_param_ptr();

  vc_i = 0;
  for (i = 0; i < YP_PARAM_MAX_MOTOR_NUM; i++)
  {
    if (!param->motor_enable[i])
      continue;

    if (p(YP_PARAM_VEHICLE_CONTROL, i) > 0)
    {
      spur->wheel_vel_smooth[i] = 0;
      spur->wheel_mode[i] = MOTOR_CONTROL_VEHICLE;

      switch (vc_i)
      {
        case 0:
          spur->wheel_vel_smooth[i] = (0.5 * spur->wref_smooth * p(YP_PARAM_TREAD, 0) + spur->vref_smooth) / p(YP_PARAM_RADIUS, i);
          break;
        case 1:
          spur->wheel_vel_smooth[i] = -(0.5 * spur->wref_smooth * p(YP_PARAM_TREAD, 0) - spur->vref_smooth) / p(YP_PARAM_RADIUS, i);
          break;
        default:
          break;
      }
      vc_i++;
    }
  }
}